

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qreadwritelock.cpp
# Opt level: O0

void __thiscall QReadWriteLock::unlock(QReadWriteLock *this)

{
  long lVar1;
  bool bVar2;
  Type pQVar3;
  Type in_RDI;
  long in_FS_OFFSET;
  QReadWriteLockPrivate *in_stack_00000018;
  QReadWriteLockPrivate *val;
  scoped_lock<std::mutex> lock;
  QReadWriteLockPrivate *d;
  Type in_stack_ffffffffffffffa8;
  Type in_stack_ffffffffffffffb0;
  QBasicAtomicPointer<QReadWriteLockPrivate> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QBasicAtomicPointer<QReadWriteLockPrivate>::loadAcquire
                     ((QBasicAtomicPointer<QReadWriteLockPrivate> *)0x6c3f0a);
  do {
    while ((Type)0x2 < pQVar3) {
      if (((ulong)pQVar3 & 3) != 1) {
        if ((pQVar3->recursive & 1U) == 0) {
          (anonymous_namespace)::qt_scoped_lock<std::mutex,std::scoped_lock<std::mutex>>
                    ((mutex *)in_stack_ffffffffffffffa8);
          if (pQVar3->writerCount == 0) {
            pQVar3->readerCount = pQVar3->readerCount + -1;
            if (pQVar3->readerCount < 1) goto LAB_006c400a;
          }
          else {
            pQVar3->writerCount = 0;
LAB_006c400a:
            if ((pQVar3->waitingReaders == 0) && (pQVar3->waitingWriters == 0)) {
              QBasicAtomicPointer<QReadWriteLockPrivate>::storeRelease
                        ((QBasicAtomicPointer<QReadWriteLockPrivate> *)in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
              QReadWriteLockPrivate::release(in_stack_ffffffffffffffb0);
            }
            else {
              QReadWriteLockPrivate::unlock(in_stack_ffffffffffffffb0);
            }
          }
          std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x6c4080);
        }
        else {
          QReadWriteLockPrivate::recursiveUnlock(in_stack_00000018);
        }
        goto LAB_006c4080;
      }
      bVar2 = QBasicAtomicPointer<QReadWriteLockPrivate>::testAndSetOrdered
                        (in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb0,
                         (Type *)in_stack_ffffffffffffffa8);
      if (bVar2) goto LAB_006c4080;
    }
    bVar2 = QBasicAtomicPointer<QReadWriteLockPrivate>::testAndSetOrdered
                      (in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb0,
                       (Type *)in_stack_ffffffffffffffa8);
  } while (!bVar2);
LAB_006c4080:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QReadWriteLock::unlock()
{
    QReadWriteLockPrivate *d = d_ptr.loadAcquire();
    while (true) {
        Q_ASSERT_X(d, "QReadWriteLock::unlock()", "Cannot unlock an unlocked lock");

        // Fast case: no contention: (no waiters, no other readers)
        if (quintptr(d) <= 2) { // 1 or 2 (StateLockedForRead or StateLockedForWrite)
            if (!d_ptr.testAndSetOrdered(d, nullptr, d))
                continue;
            return;
        }

        if ((quintptr(d) & StateMask) == StateLockedForRead) {
            Q_ASSERT(quintptr(d) > (1U<<4)); //otherwise that would be the fast case
            // Just decrease the reader's count.
            auto val = reinterpret_cast<QReadWriteLockPrivate *>(quintptr(d) - (1U<<4));
            if (!d_ptr.testAndSetOrdered(d, val, d))
                continue;
            return;
        }

        Q_ASSERT(!isUncontendedLocked(d));

        if (d->recursive) {
            d->recursiveUnlock();
            return;
        }

        const auto lock = qt_scoped_lock(d->mutex);
        if (d->writerCount) {
            Q_ASSERT(d->writerCount == 1);
            Q_ASSERT(d->readerCount == 0);
            d->writerCount = 0;
        } else {
            Q_ASSERT(d->readerCount > 0);
            d->readerCount--;
            if (d->readerCount > 0)
                return;
        }

        if (d->waitingReaders || d->waitingWriters) {
            d->unlock();
        } else {
            Q_ASSERT(d_ptr.loadRelaxed() == d); // should not change when we still hold the mutex
            d_ptr.storeRelease(nullptr);
            d->release();
        }
        return;
    }
}